

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O3

void __thiscall
cm::String::String<std::__cxx11::string_const&,void>
          (String *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  string local_40;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_60 = &local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar1,pcVar1 + s->_M_string_length)
  ;
  if (local_60 == &local_50) {
    local_40.field_2._8_8_ = local_50._8_8_;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)local_60;
  }
  local_40.field_2._M_allocated_capacity._1_7_ = local_50._M_allocated_capacity._1_7_;
  local_40.field_2._M_local_buf[0] = local_50._M_local_buf[0];
  local_40._M_string_length = local_58;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_60 = &local_50;
  String(this,&local_40,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(local_50._M_allocated_capacity._1_7_,local_50._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

String(T&& s)
    : String(IntoString<T>::into_string(std::forward<T>(s)), Private())
  {
  }